

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

EmptyMemberSymbol * __thiscall
slang::BumpAllocator::emplace<slang::ast::EmptyMemberSymbol,slang::SourceLocation>
          (BumpAllocator *this,SourceLocation *args)

{
  SourceLocation SVar1;
  EmptyMemberSymbol *pEVar2;
  
  pEVar2 = (EmptyMemberSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((EmptyMemberSymbol *)this->endPtr < pEVar2 + 1) {
    pEVar2 = (EmptyMemberSymbol *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pEVar2 + 1);
  }
  SVar1 = *args;
  (pEVar2->super_Symbol).kind = EmptyMember;
  (pEVar2->super_Symbol).name._M_len = 0;
  (pEVar2->super_Symbol).name._M_str = "";
  (pEVar2->super_Symbol).location = SVar1;
  (pEVar2->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (pEVar2->super_Symbol).parentScope = (Scope *)0x0;
  (pEVar2->super_Symbol).nextInScope = (Symbol *)0x0;
  (pEVar2->super_Symbol).indexInScope = 0;
  return pEVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }